

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O0

int If_CutSopBalancePinDelays(If_Man_t *p,If_Cut_t *pCut,char *pPerm)

{
  Vec_Wec_t *p_00;
  int iVar1;
  If_Obj_t *pIVar2;
  If_Cut_t *pIVar3;
  Vec_Int_t *p_01;
  int local_78 [2];
  int pTimes [15];
  int local_34;
  int i;
  Vec_Int_t *vCover;
  char *pPerm_local;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  if (*(uint *)&pCut->field_0x1c >> 0x18 == 0) {
    p_local._4_4_ = 0;
  }
  else if (*(uint *)&pCut->field_0x1c >> 0x18 == 1) {
    *pPerm = '\0';
    pIVar2 = If_CutLeaf(p,pCut,0);
    pIVar3 = If_ObjCutBest(pIVar2);
    p_local._4_4_ = (int)pIVar3->Delay;
  }
  else {
    p_00 = p->vTtIsops[*(uint *)&pCut->field_0x1c >> 0x18];
    iVar1 = If_CutTruthLit(pCut);
    iVar1 = Abc_Lit2Var(iVar1);
    p_01 = Vec_WecEntry(p_00,iVar1);
    iVar1 = Vec_IntSize(p_01);
    if (iVar1 == 0) {
      p_local._4_4_ = -1;
    }
    else {
      local_34 = 0;
      while( true ) {
        iVar1 = If_CutLeaveNum(pCut);
        if (iVar1 <= local_34) break;
        pIVar2 = If_CutLeaf(p,pCut,local_34);
        pIVar3 = If_ObjCutBest(pIVar2);
        pTimes[(long)local_34 + -2] = (int)pIVar3->Delay;
        local_34 = local_34 + 1;
      }
      iVar1 = If_CutLeaveNum(pCut);
      p_local._4_4_ = If_CutSopBalancePinDelaysIntInt(p_01,local_78,iVar1,pPerm);
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_CutSopBalancePinDelays( If_Man_t * p, If_Cut_t * pCut, char * pPerm )
{
    if ( pCut->nLeaves == 0 ) // const
        return 0;
    if ( pCut->nLeaves == 1 ) // variable
    {
        pPerm[0] = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        Vec_Int_t * vCover;
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        vCover = Vec_WecEntry( p->vTtIsops[pCut->nLeaves], Abc_Lit2Var(If_CutTruthLit(pCut)) );
        if ( Vec_IntSize(vCover) == 0 )
            return -1;
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay; 
        return If_CutSopBalancePinDelaysIntInt( vCover, pTimes, If_CutLeaveNum(pCut), pPerm );
    }
}